

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

bool __thiscall
SymbolTable::addEquation
          (SymbolTable *this,wstring *name,uint file,uint section,wstring *replacement)

{
  pointer pwVar1;
  pointer pEVar2;
  bool bVar3;
  uint *puVar4;
  mapped_type *pmVar5;
  uint section_local;
  uint file_local;
  wstring *local_b0;
  pointer local_a8;
  Equation equation;
  SymbolKey key;
  
  puVar4 = &section_local;
  section_local = section;
  file_local = file;
  bVar3 = isValidSymbolName(name);
  if ((!bVar3) || (bVar3 = symbolExists(this,name,file,section), bVar3)) {
    return false;
  }
  pwVar1 = (name->_M_dataplus)._M_p;
  if (*pwVar1 == L'@') {
    if (pwVar1[1] == L'@') goto LAB_0013960b;
  }
  else {
    section_local = 0xffffffff;
    puVar4 = &file_local;
  }
  *puVar4 = 0xffffffff;
  section = section_local;
  file = file_local;
LAB_0013960b:
  local_b0 = replacement;
  std::__cxx11::wstring::wstring((wstring *)&key,(wstring *)name);
  local_a8 = (this->equations).
             super__Vector_base<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->equations).
           super__Vector_base<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>._M_impl
           .super__Vector_impl_data._M_finish;
  key.file = file;
  key.section = section;
  pmVar5 = std::
           map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
           ::operator[](&this->symbols,&key);
  pmVar5->type = EquationSymbol;
  pmVar5->index = ((long)pEVar2 - (long)local_a8) / 0x48;
  std::__cxx11::wstring::wstring((wstring *)&equation,(wstring *)name);
  std::__cxx11::wstring::wstring((wstring *)&equation.value,(wstring *)local_b0);
  equation.file = file;
  equation.section = section;
  std::vector<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>::push_back
            (&this->equations,&equation);
  Equation::~Equation(&equation);
  std::__cxx11::wstring::~wstring((wstring *)&key);
  return true;
}

Assistant:

bool SymbolTable::addEquation(const std::wstring& name, unsigned int file, unsigned int section, std::wstring& replacement)
{
	if (isValidSymbolName(name) == false)
		return false;

	if (symbolExists(name,file,section))
		return false;
	
	setFileSectionValues(name,file,section);

	SymbolKey key = { name, file, section };
	SymbolInfo value = { EquationSymbol, equations.size() };
	symbols[key] = value;

	Equation equation = { name, replacement, file, section };
	equations.push_back(equation);
	return true;
}